

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressmap-inl.h
# Opt level: O0

Cluster ** __thiscall
AddressMap<HeapProfileTable::AllocValue>::New<AddressMap<HeapProfileTable::AllocValue>::Cluster*>
          (AddressMap<HeapProfileTable::AllocValue> *this,int num)

{
  Object *__s;
  Object *obj;
  void *ptr;
  int num_local;
  AddressMap<HeapProfileTable::AllocValue> *this_local;
  
  __s = (Object *)(*this->alloc_)((long)num * 8 + 8);
  memset(__s,0,(long)num * 8 + 8);
  __s->next = this->allocated_;
  this->allocated_ = __s;
  return (Cluster **)(__s + 1);
}

Assistant:

T* New(int num) {
    void* ptr = (*alloc_)(sizeof(Object) + num*sizeof(T));
    memset(ptr, 0, sizeof(Object) + num*sizeof(T));
    Object* obj = reinterpret_cast<Object*>(ptr);
    obj->next = allocated_;
    allocated_ = obj;
    return reinterpret_cast<T*>(reinterpret_cast<Object*>(ptr) + 1);
  }